

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollisionObject.cpp
# Opt level: O2

aphy_transform * __thiscall
APhyBullet::BulletCollisionObject::getTransform
          (aphy_transform *__return_storage_ptr__,BulletCollisionObject *this)

{
  convertTransform(__return_storage_ptr__,&this->handle->m_worldTransform);
  return __return_storage_ptr__;
}

Assistant:

aphy_transform BulletCollisionObject::getTransform()
{
    return convertTransform(handle->getWorldTransform());
}